

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool __thiscall
llvm::cl::Option::error(Option *this,Twine *Message,StringRef ArgName,raw_ostream *Errs)

{
  CommandLineParser *Str;
  raw_ostream *prVar1;
  size_t sVar2;
  char *pcVar3;
  StringRef Str_00;
  
  sVar2 = ArgName.Length;
  pcVar3 = ArgName.Data;
  if (pcVar3 == (char *)0x0) {
    sVar2 = (this->ArgStr).Length;
  }
  if (sVar2 == 0) {
    pcVar3 = (this->HelpStr).Data;
    sVar2 = (this->HelpStr).Length;
    prVar1 = Errs;
  }
  else {
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (this->ArgStr).Data;
    }
    Str = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
          ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                        *)this);
    prVar1 = raw_ostream::operator<<(Errs,&Str->ProgramName);
    prVar1 = raw_ostream::operator<<(prVar1,": for the -");
  }
  Str_00.Length = sVar2;
  Str_00.Data = pcVar3;
  raw_ostream::operator<<(prVar1,Str_00);
  prVar1 = raw_ostream::operator<<(Errs," option: ");
  Twine::print(Message,prVar1);
  raw_ostream::operator<<(prVar1,"\n");
  return true;
}

Assistant:

bool Option::error(const Twine &Message, StringRef ArgName, raw_ostream &Errs) {
  if (!ArgName.data())
    ArgName = ArgStr;
  if (ArgName.empty())
    Errs << HelpStr; // Be nice for positional arguments
  else
    Errs << GlobalParser->ProgramName << ": for the -" << ArgName;

  Errs << " option: " << Message << "\n";
  return true;
}